

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
           *this,char16_t **key,StorageInfo *value)

{
  BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  anon_union_8_2_b9cdfb1b_for_StorageInfo_1 aVar5;
  bool bVar6;
  hash_t hVar7;
  int iVar8;
  int iVar9;
  char16_t *pcVar10;
  undefined4 *puVar11;
  char16_t cVar12;
  ushort *puVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  
  lVar20 = *(long *)this;
  if (lVar20 == 0) {
    BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar20 = *(long *)this;
  }
  pcVar10 = *key;
  cVar12 = *pcVar10;
  if (cVar12 == L'\0') {
    uVar15 = 0x2393b8b;
  }
  else {
    uVar15 = 0x811c9dc5;
    do {
      pcVar10 = pcVar10 + 1;
      uVar16 = (ushort)cVar12 ^ uVar15;
      uVar15 = uVar16 * 0x1000193;
      cVar12 = *pcVar10;
    } while (cVar12 != L'\0');
    uVar15 = uVar16 * 0x2000326 + 1;
  }
  hVar7 = PrimePolicy::ModPrime(uVar15 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar16 = *(uint *)(lVar20 + (ulong)hVar7 * 4);
  if ((int)uVar16 < 0) {
    uVar19 = 0;
  }
  else {
    lVar20 = *(long *)(this + 8);
    uVar19 = 0;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      puVar13 = *(ushort **)(lVar20 + 0x18 + (ulong)uVar16 * 0x28);
      uVar14 = *puVar13;
      if (uVar14 == 0) {
        uVar17 = 0x2393b8b;
      }
      else {
        uVar17 = 0x811c9dc5;
        do {
          puVar13 = puVar13 + 1;
          uVar18 = uVar14 ^ uVar17;
          uVar17 = uVar18 * 0x1000193;
          uVar14 = *puVar13;
        } while (uVar14 != 0);
        uVar17 = uVar18 * 0x2000326 + 1;
      }
      lVar2 = lVar20 + (ulong)uVar16 * 0x28;
      if (uVar17 != *(uint *)(lVar2 + 0x20)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                           ,199,
                           "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                           ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
        if (!bVar6) goto LAB_0096ea3e;
        *puVar11 = 0;
        uVar17 = *(uint *)(lVar2 + 0x20);
      }
      if ((uVar17 == uVar15) && (iVar8 = PAL_wcscmp(*(char16_t **)(lVar2 + 0x18),*key), iVar8 == 0))
      {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar19);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar6) {
          *puVar11 = 0;
          return -1;
        }
        goto LAB_0096ea3e;
      }
      uVar19 = uVar19 + 1;
      uVar16 = *(uint *)(lVar2 + 0x10);
    } while (-1 < (int)uVar16);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar19);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar9 = *(int *)(this + 0x18);
    iVar8 = *(int *)(this + 0x20);
    if (iVar8 == iVar9) {
      BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      hVar7 = PrimePolicy::ModPrime(uVar15 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar9 = *(int *)(this + 0x18);
      iVar8 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar8 + 1;
    if (iVar9 < iVar8 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar6) goto LAB_0096ea3e;
      *puVar11 = 0;
      iVar9 = *(int *)(this + 0x18);
    }
    if (iVar9 <= iVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar6) goto LAB_0096ea3e;
      *puVar11 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar6) goto LAB_0096ea3e;
      *puVar11 = 0;
    }
    iVar8 = *(int *)(this + 0x24);
    if (iVar8 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar6) goto LAB_0096ea3e;
      *puVar11 = 0;
      iVar8 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar6) {
LAB_0096ea3e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
      iVar8 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar9 = BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar8 * 0x28 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar9;
    }
  }
  lVar20 = *(long *)(this + 8);
  lVar4 = (long)iVar8 * 0x28;
  aVar5 = value->field_1;
  *(undefined8 *)(lVar20 + lVar4) = *(undefined8 *)value;
  *(anon_union_8_2_b9cdfb1b_for_StorageInfo_1 *)((undefined8 *)(lVar20 + lVar4) + 1) = aVar5;
  *(char16_t **)(lVar20 + 0x18 + lVar4) = *key;
  *(uint *)(lVar20 + 0x20 + lVar4) = uVar15;
  lVar20 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  *(undefined4 *)(lVar2 + 0x10 + lVar4) = *(undefined4 *)(lVar20 + (ulong)hVar7 * 4);
  *(int *)(lVar20 + (ulong)hVar7 * 4) = iVar8;
  uVar19 = 0;
  iVar9 = iVar8;
  do {
    iVar9 = *(int *)(lVar2 + 0x10 + (long)iVar9 * 0x28);
    uVar19 = uVar19 + 1;
  } while (iVar9 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar19);
  }
  return iVar8;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }